

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TiledRgbaOutputFile::setFrameBuffer
          (TiledRgbaOutputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  pthread_mutex_t *__mutex;
  ToYa *pTVar1;
  bool ytc;
  bool ytc_00;
  bool ytc_01;
  undefined1 in_R10B;
  lock_guard<std::mutex> lock;
  size_t yst;
  size_t xst;
  FrameBuffer fb;
  Slice local_60;
  
  __mutex = (pthread_mutex_t *)this->_toYa;
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    pTVar1 = this->_toYa;
    pTVar1->_fbBase = base;
    pTVar1->_fbXStride = xStride;
    pTVar1->_fbYStride = yStride;
    pthread_mutex_unlock(__mutex);
    return;
  }
  xst = xStride << 3;
  yst = yStride << 3;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Slice::Slice(&local_60,HALF,(char *)base,xst,yst,1,1,0.0,(bool)in_R10B,
               SUB81(fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
  FrameBuffer::insert(&fb,"R",&local_60);
  Slice::Slice(&local_60,HALF,(char *)&base->g,xst,yst,1,1,0.0,(bool)in_R10B,ytc);
  FrameBuffer::insert(&fb,"G",&local_60);
  Slice::Slice(&local_60,HALF,(char *)&base->b,xst,yst,1,1,0.0,(bool)in_R10B,ytc_00);
  FrameBuffer::insert(&fb,"B",&local_60);
  Slice::Slice(&local_60,HALF,(char *)&base->a,xst,yst,1,1,0.0,(bool)in_R10B,ytc_01);
  FrameBuffer::insert(&fb,"A",&local_60);
  TiledOutputFile::setFrameBuffer(this->_outputFile,&fb);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&fb);
  return;
}

Assistant:

void
TiledRgbaOutputFile::setFrameBuffer (
    const Rgba* base, size_t xStride, size_t yStride)
{
    if (_toYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_toYa);
#endif
        _toYa->setFrameBuffer (base, xStride, yStride);
    }
    else
    {
        size_t xs = xStride * sizeof (Rgba);
        size_t ys = yStride * sizeof (Rgba);

        FrameBuffer fb;

        fb.insert ("R", Slice (HALF, (char*) &base[0].r, xs, ys));
        fb.insert ("G", Slice (HALF, (char*) &base[0].g, xs, ys));
        fb.insert ("B", Slice (HALF, (char*) &base[0].b, xs, ys));
        fb.insert ("A", Slice (HALF, (char*) &base[0].a, xs, ys));

        _outputFile->setFrameBuffer (fb);
    }
}